

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode h2_progress_egress(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  uint *local_48;
  undefined1 local_40 [8];
  nghttp2_priority_spec pri_spec;
  int rv;
  stream_ctx *stream;
  cf_h2_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined8 *)cf->ctx;
  if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
    local_48 = (uint *)0x0;
  }
  else {
    local_48 = (uint *)((data->req).p.http)->h2_ctx;
  }
  stack0xffffffffffffffd0 = local_48;
  pri_spec.weight = 0;
  if ((local_48 != (uint *)0x0) && (0 < (int)*local_48)) {
    iVar2 = sweight_wanted(data);
    iVar3 = sweight_in_effect(data);
    if ((iVar2 != iVar3) ||
       ((((data->set).priority.field_0x14 & 1) != ((data->state).priority.field_0x14 & 1) ||
        ((data->set).priority.parent != (data->state).priority.parent)))) {
      h2_pri_spec(data,(nghttp2_priority_spec *)local_40);
      if ((data != (Curl_easy *)0x0) &&
         ((((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0 && (cf != (Curl_cfilter *)0x0)) &&
          (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"[%d] Queuing PRIORITY",(ulong)*stack0xffffffffffffffd0);
      }
      pri_spec.weight =
           nghttp2_submit_priority
                     ((nghttp2_session *)*puVar1,'\0',*stack0xffffffffffffffd0,
                      (nghttp2_priority_spec *)local_40);
      if (pri_spec.weight != 0) goto LAB_00abe537;
    }
  }
  *(byte *)(puVar1 + 0x19) = *(byte *)(puVar1 + 0x19) & 0xf7;
  while( true ) {
    bVar5 = false;
    if ((pri_spec.weight == 0) && (bVar5 = false, (*(byte *)(puVar1 + 0x19) >> 3 & 1) == 0)) {
      iVar2 = nghttp2_session_want_write((nghttp2_session *)*puVar1);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    pri_spec.weight = nghttp2_session_send((nghttp2_session *)*puVar1);
  }
LAB_00abe537:
  iVar2 = nghttp2_is_fatal(pri_spec.weight);
  if (iVar2 == 0) {
    cf_local._4_4_ = nw_out_flush(cf,data);
  }
  else {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      pcVar4 = nghttp2_strerror(pri_spec.weight);
      Curl_trc_cf_infof(data,cf,"nghttp2_session_send error (%s)%d",pcVar4,
                        (ulong)(uint)pri_spec.weight);
    }
    cf_local._4_4_ = CURLE_SEND_ERROR;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode h2_progress_egress(struct Curl_cfilter *cf,
                                  struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  int rv = 0;

  if(stream && stream->id > 0 &&
     ((sweight_wanted(data) != sweight_in_effect(data)) ||
      (data->set.priority.exclusive != data->state.priority.exclusive) ||
      (data->set.priority.parent != data->state.priority.parent)) ) {
    /* send new weight and/or dependency */
    nghttp2_priority_spec pri_spec;

    h2_pri_spec(data, &pri_spec);
    CURL_TRC_CF(data, cf, "[%d] Queuing PRIORITY", stream->id);
    DEBUGASSERT(stream->id != -1);
    rv = nghttp2_submit_priority(ctx->h2, NGHTTP2_FLAG_NONE,
                                 stream->id, &pri_spec);
    if(rv)
      goto out;
  }

  ctx->nw_out_blocked = 0;
  while(!rv && !ctx->nw_out_blocked && nghttp2_session_want_write(ctx->h2))
    rv = nghttp2_session_send(ctx->h2);

out:
  if(nghttp2_is_fatal(rv)) {
    CURL_TRC_CF(data, cf, "nghttp2_session_send error (%s)%d",
                nghttp2_strerror(rv), rv);
    return CURLE_SEND_ERROR;
  }
  return nw_out_flush(cf, data);
}